

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_CountNonExist_Test::TestBody(TApp_CountNonExist_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  AssertHelper local_100;
  Message local_f8 [2];
  OptionNotFound *anon_var_0;
  string local_e0;
  byte local_b9;
  char *pcStack_b8;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  iterator local_80;
  size_type local_78;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  TApp_CountNonExist_Test *local_10;
  TApp_CountNonExist_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"-c,--count",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"",&local_69);
  CLI::App::add_flag(&(this->super_TApp).app,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  gtest_msg.value._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"-c",(allocator *)((long)&gtest_msg.value + 7));
  gtest_msg.value._6_1_ = 0;
  local_80 = &local_a0;
  local_78 = 1;
  __l._M_len = 1;
  __l._M_array = local_80;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80;
  do {
    local_138 = local_138 + -1;
    std::__cxx11::string::~string((string *)local_138);
  } while (local_138 != &local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  TApp::run(&this->super_TApp);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff48,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff48);
  if (bVar1) {
    local_b9 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_e0,"--nonexist",(allocator *)((long)&anon_var_0 + 7));
      CLI::App::count(&(this->super_TApp).app,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
    }
    if ((local_b9 & 1) != 0) {
      return;
    }
    pcStack_b8 = 
    "Expected: app.count(\"--nonexist\") throws an exception of type CLI::OptionNotFound.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_f8);
  testing::internal::AssertHelper::AssertHelper
            (&local_100,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x10,pcStack_b8);
  testing::internal::AssertHelper::operator=(&local_100,local_f8);
  testing::internal::AssertHelper::~AssertHelper(&local_100);
  testing::Message::~Message(local_f8);
  return;
}

Assistant:

TEST_F(TApp, CountNonExist) {
    app.add_flag("-c,--count");
    args = {"-c"};
    run();
    EXPECT_THROW(app.count("--nonexist"), CLI::OptionNotFound);
}